

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O0

URegistryKey __thiscall
icu_63::ICULocaleService::registerInstance
          (ICULocaleService *this,UObject *objToAdopt,Locale *locale,int32_t kind,int32_t coverage,
          UErrorCode *status)

{
  int iVar1;
  SimpleLocaleKeyFactory *this_00;
  undefined4 extraout_var;
  SimpleLocaleKeyFactory *local_60;
  ICUServiceFactory *factory;
  UErrorCode *status_local;
  int32_t coverage_local;
  int32_t kind_local;
  Locale *locale_local;
  UObject *objToAdopt_local;
  ICULocaleService *this_local;
  
  this_00 = (SimpleLocaleKeyFactory *)UMemory::operator_new((UMemory *)0xa0,(size_t)objToAdopt);
  local_60 = (SimpleLocaleKeyFactory *)0x0;
  if (this_00 != (SimpleLocaleKeyFactory *)0x0) {
    SimpleLocaleKeyFactory::SimpleLocaleKeyFactory(this_00,objToAdopt,locale,kind,coverage);
    local_60 = this_00;
  }
  if (local_60 == (SimpleLocaleKeyFactory *)0x0) {
    if (objToAdopt != (UObject *)0x0) {
      (*objToAdopt->_vptr_UObject[1])();
    }
    this_local = (ICULocaleService *)0x0;
  }
  else {
    iVar1 = (*(this->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[9])(this,local_60,status)
    ;
    this_local = (ICULocaleService *)CONCAT44(extraout_var,iVar1);
  }
  return this_local;
}

Assistant:

URegistryKey
ICULocaleService::registerInstance(UObject* objToAdopt, const Locale& locale, int32_t kind, int32_t coverage, UErrorCode& status)
{
    ICUServiceFactory * factory = new SimpleLocaleKeyFactory(objToAdopt, locale, kind, coverage);
    if (factory != NULL) {
        return registerFactory(factory, status);
    }
    delete objToAdopt;
    return NULL;
}